

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-textblock.c
# Opt level: O2

void text_out_to_file(uint8_t a,char *str)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  wchar_t wVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  wchar_t wVar8;
  byte *buf_00;
  wchar_t i;
  wchar_t wVar9;
  byte *pbVar10;
  size_t n;
  char buf [1024];
  
  buf_00 = (byte *)buf;
  wVar8 = L'K';
  if (text_out_wrap != L'\0') {
    wVar8 = text_out_wrap;
  }
  my_strcpy(buf,str,0x400);
LAB_001ea904:
  do {
    if (*buf_00 == 0) {
      return;
    }
    uVar3 = wVar8 - text_out_to_file::pos;
    if (wVar8 - text_out_to_file::pos < 1) {
      uVar3 = 0;
    }
    wVar4 = text_out_to_file::pos;
    if (text_out_to_file::pos == L'\0') {
      wVar4 = L'\0';
      for (wVar9 = L'\0'; wVar9 < text_out_indent; wVar9 = wVar9 + L'\x01') {
        file_writec(text_out_file,' ');
        wVar4 = text_out_to_file::pos + L'\x01';
        text_out_to_file::pos = wVar4;
      }
    }
    uVar5 = 0xffffffffffffffff;
    for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
      bVar2 = buf_00[uVar7];
      if ((bVar2 == 0) || (bVar2 == 10)) goto LAB_001ea985;
      if (bVar2 == 0x20) {
        uVar5 = uVar7;
      }
      uVar5 = uVar5 & 0xffffffff;
    }
    uVar7 = (ulong)uVar3;
LAB_001ea985:
    uVar6 = (uint)uVar7;
    if (((uint)uVar5 == 0xffffffff) && (uVar6 == uVar3)) {
      uVar6 = uVar3;
      if (wVar4 != text_out_indent) {
        if ((0x2e < (ulong)*buf_00) || ((0x500100000000U >> ((ulong)*buf_00 & 0x3f) & 1) == 0)) {
          file_writec(text_out_file,'\n');
          text_out_to_file::pos = L'\0';
          goto LAB_001ea904;
        }
        uVar6 = 1;
      }
    }
    else if ((buf_00[uVar7 & 0xffffffff] != 0) && (buf_00[uVar7 & 0xffffffff] != 10)) {
      uVar6 = (uint)uVar5;
    }
    n = (size_t)(int)uVar6;
    file_write(text_out_file,(char *)buf_00,n);
    text_out_to_file::pos = text_out_to_file::pos + uVar6;
    pbVar10 = buf_00 + n;
    if (buf_00[n] == 10) {
      pbVar10 = pbVar10 + 1;
    }
    else if (buf_00[n] == 0) {
      return;
    }
    file_writec(text_out_file,'\n');
    text_out_to_file::pos = L'\0';
    pbVar10 = pbVar10 + -1;
    do {
      buf_00 = pbVar10 + 1;
      pbVar1 = pbVar10 + 1;
      pbVar10 = buf_00;
    } while (*pbVar1 == 0x20);
  } while( true );
}

Assistant:

void text_out_to_file(uint8_t a, const char *str)
{
	const char *s;
	char buf[1024];

	/* Current position on the line */
	static int pos = 0;

	/* Wrap width */
	int wrap = (text_out_wrap ? text_out_wrap : 75);

	/* Unused parameter */
	(void)a;

	/* Copy to a rewriteable string */
 	my_strcpy(buf, str, 1024);

	/* Current location within "buf" */
 	s = buf;

	/* Process the string */
	while (*s) {
		int n = 0;
		int len = wrap - pos;
		int l_space = -1;

		/* In case we are already past the wrap point (which can happen with
		 * punctuation at the end of the line), make sure we don't overrun.
		 */
		if (len < 0)
			len = 0;

		/* If we are at the start of the line... */
		if (pos == 0) {
			int i;

			/* Output the indent */
			for (i = 0; i < text_out_indent; i++) {
				file_writec(text_out_file, ' ');
				pos++;
			}
		}

		/* Find length of line up to next newline or end-of-string */
		while ((n < len) && !((s[n] == '\n') || (s[n] == '\0'))) {
			/* Mark the most recent space in the string */
			if (s[n] == ' ') l_space = n;

			/* Increment */
			n++;
		}

		/* If we have encountered no spaces */
		if ((l_space == -1) && (n == len)) {
			/* If we are at the start of a new line */
			if (pos == text_out_indent) {
				len = n;
			} else if ((s[0] == ' ') || (s[0] == ',') || (s[0] == '.')) {
				/* HACK - Output punctuation at the end of the line */
				len = 1;
			} else {
				/* Begin a new line */
				file_writec(text_out_file, '\n');

				/* Reset */
				pos = 0;

				continue;
			}
		} else {
			/* Wrap at the newline */
			if ((s[n] == '\n') || (s[n] == '\0')) len = n;

			/* Wrap at the last space */
			else len = l_space;
		}

		/* Write that line to file */
		file_write(text_out_file, s, len);
		pos += len;

		/* Move 's' past the stuff we've written */
		s += len;

		/* If we are at the end of the string, end */
		if (*s == '\0') return;

		/* Skip newlines */
		if (*s == '\n') s++;

		/* Begin a new line */
		file_writec(text_out_file, '\n');

		/* Reset */
		pos = 0;

		/* Skip whitespace */
		while (*s == ' ') s++;
	}

	/* We are done */
	return;
}